

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CommitShaderResources
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,
          IShaderResourceBinding *pShaderResourceBinding,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,int param_3)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  RESOURCE_STATE_TRANSITION_MODE extraout_DL;
  RESOURCE_STATE_TRANSITION_MODE Type;
  char (*in_R9) [8];
  string msg;
  string local_60;
  String local_40;
  
  CVar2 = (this->m_Desc).QueueType;
  Type = StateTransitionMode;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_60,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"CommitShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x328);
      std::__cxx11::string::~string((string *)&local_60);
    }
    FormatString<char[97]>
              (&local_60,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"CommitShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x328);
    std::__cxx11::string::~string((string *)&local_60);
    CVar2 = (this->m_Desc).QueueType;
    Type = extraout_DL;
  }
  if ((~CVar2 & 3) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[22],char[22],std::__cxx11::string,char[8]>
              (&local_60,(Diligent *)"CommitShaderResources",(char (*) [22])0x65e20a,
               (char (*) [22])&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_40);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"CommitShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x328);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
     ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0)) {
    FormatString<char[188]>
              (&local_60,
               (char (*) [188])
               "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
              );
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"CommitShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x32b);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (pShaderResourceBinding == (IShaderResourceBinding *)0x0) {
    FormatString<char[40]>(&local_60,(char (*) [40])0x5c204b);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"CommitShaderResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x32d);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.CommitShaderResources;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::CommitShaderResources(
    IShaderResourceBinding*        pShaderResourceBinding,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,
    int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_COMPUTE, "CommitShaderResources");
    DEV_CHECK_ERR(!(m_pActiveRenderPass != nullptr && StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION),
                  "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                  "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

    DEV_CHECK_ERR(pShaderResourceBinding != nullptr, "pShaderResourceBinding must not be null");

    ++m_Stats.CommandCounters.CommitShaderResources;
}